

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.h
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::GED_EnhancedGroundCombatSoldier
          (GED_EnhancedGroundCombatSoldier *this,GED_BasicGroundCombatSoldier *BGCS,
          KUINT8 WaterStatus,RestStatus R,KUINT8 PrimaryAmmunition,KUINT8 SecondaryAmmunition)

{
  KINT16 KVar1;
  KINT16 KVar2;
  KINT16 KVar3;
  KINT8 KVar4;
  KINT8 KVar5;
  KINT8 KVar6;
  KINT8 KVar7;
  KINT8 KVar8;
  KINT8 KVar9;
  KINT8 KVar10;
  
  (this->super_GED_BasicGroundCombatSoldier).super_GED.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatSoldier_00225bc0;
  KVar1 = BGCS->m_i16Offsets[0];
  KVar2 = BGCS->m_i16Offsets[1];
  KVar3 = BGCS->m_i16Offsets[2];
  (this->super_GED_BasicGroundCombatSoldier).m_ui16EntityID = BGCS->m_ui16EntityID;
  (this->super_GED_BasicGroundCombatSoldier).m_i16Offsets[0] = KVar1;
  (this->super_GED_BasicGroundCombatSoldier).m_i16Offsets[1] = KVar2;
  (this->super_GED_BasicGroundCombatSoldier).m_i16Offsets[2] = KVar3;
  (this->super_GED_BasicGroundCombatSoldier).m_EA.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_00225360;
  (this->super_GED_BasicGroundCombatSoldier).m_EA.m_Appearance = (BGCS->m_EA).m_Appearance;
  KVar4 = BGCS->m_i8Ori[1];
  KVar5 = BGCS->m_i8Ori[2];
  KVar6 = BGCS->m_i8Spd;
  KVar7 = BGCS->m_i8HdAz;
  KVar8 = BGCS->m_i8HdElv;
  KVar9 = BGCS->m_i8HdScanRt;
  KVar10 = BGCS->m_i8HdElvRt;
  (this->super_GED_BasicGroundCombatSoldier).m_i8Ori[0] = BGCS->m_i8Ori[0];
  (this->super_GED_BasicGroundCombatSoldier).m_i8Ori[1] = KVar4;
  (this->super_GED_BasicGroundCombatSoldier).m_i8Ori[2] = KVar5;
  (this->super_GED_BasicGroundCombatSoldier).m_i8Spd = KVar6;
  (this->super_GED_BasicGroundCombatSoldier).m_i8HdAz = KVar7;
  (this->super_GED_BasicGroundCombatSoldier).m_i8HdElv = KVar8;
  (this->super_GED_BasicGroundCombatSoldier).m_i8HdScanRt = KVar9;
  (this->super_GED_BasicGroundCombatSoldier).m_i8HdElvRt = KVar10;
  (this->super_GED_BasicGroundCombatSoldier).super_GED.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_EnhancedGroundCombatSoldier_00225d60;
  this->m_ui8WaterStatus = WaterStatus;
  this->m_ui8RestStatus = (KUINT8)R;
  this->m_ui8PriAmmun = PrimaryAmmunition;
  this->m_ui8SecAmmun = SecondaryAmmunition;
  return;
}

Assistant:

class KDIS_EXPORT GED_BasicGroundCombatSoldier : public GED
{
protected:

    KUINT16 m_ui16EntityID;

    KINT16 m_i16Offsets[3];

    EntityAppearance m_EA;

    KINT8 m_i8Ori[3];

    KINT8 m_i8Spd;

    KINT8 m_i8HdAz;

    KINT8 m_i8HdElv;

    KINT8 m_i8HdScanRt;

    KINT8 m_i8HdElvRt;

public:

    static const KUINT16 GED_BASIC_GROUND_COMBAT_SOLDIER_SIZE = 20;

    GED_BasicGroundCombatSoldier();

    GED_BasicGroundCombatSoldier(KDataStream &stream) noexcept(false);

    GED_BasicGroundCombatSoldier( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA,
                                  KINT8 Psi, KINT8 Theta, KINT8 Phi, KINT8 Speed, KINT8 HeadAzimuth, KINT8 HeadElevation,
                                  KINT8 HeadScanRate, KINT8 HeadElevationRate );

    virtual ~GED_BasicGroundCombatSoldier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetGroupedEntityCategory
    // Description: Identifies the derived GED class.
    //              Not part of the DIS PDU.
    //************************************
    virtual KDIS::DATA_TYPE::ENUMS::GroupedEntityCategory GetGroupedEntityCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetLength
    // Description: Returns size of the GED in octets.
    //              Not part of the DIS PDU.
    //************************************
    virtual KUINT8 GetLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityID
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityID
    // Description: Entity identifier unique within the group.
    //              The Site Identifier and Application Identifiers shall be the same as
    //              those designated in the Group Entity ID field.
    // Parameter:   KUINT16 ID, void
    //************************************
    void SetEntityID( KUINT16 ID );
    KUINT16 GetEntityID() const;

    //************************************
    //              GetEntityLocationZOffset
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityLocation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityLocationZOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityLocationZOffset
    // Description: Location of the grouped entity specified by a set of three offsets.
    //              Determined by the difference, in meters, of the grouped entity from the Group Reference Point.
    // Parameter:   KINT16, void
    //************************************
    void SetEntityLocation( KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset );
    void SetEntityLocation( KINT16 Offsets[3] );
    void SetEntityLocationXOffset( KINT16 X );
    void SetEntityLocationYOffset( KINT16 Y );
    void SetEntityLocationZOffset( KINT16 Z );
    KINT16 GetEntityLocationXOffset() const;
    KINT16 GetEntityLocationYOffset() const;
    KINT16 GetEntityLocationZOffset() const;

    //************************************
    // FullName:    KDIS::PDU::GED_BasicGroundCombatSoldier::SetEntityAppearance
    //              KDIS::PDU::GED_BasicGroundCombatSoldier::GetEntityAppearance
    // Description: Entity Appearance bit field accessors/mutator
    // Parameter:   const EntityAppearance & EA, void
    //************************************
    void SetEntityAppearance( const EntityAppearance & EA );
    const EntityAppearance & GetEntityAppearance() const;
    EntityAppearance & GetEntityAppearance();

    //************************************
    //              GetEntityOrientationPhi
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityOrientation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetEntityOrientationPhi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetEntityOrientationPhi
    // Description: Entity Orientation in euler angles, psi, theta and phi, in 25 milliradian increments.
    // Parameter:   KINT8, void
    //************************************
    void SetEntityOrientation( KINT8 Psi, KINT8 Theta, KINT8 Phi );
    void SetEntityOrientation( KINT8 Ori[3] );
    void SetEntityOrientationPsi( KINT8 P );
    void SetEntityOrientationTheta( KINT8 T );
    void SetEntityOrientationPhi( KINT8 P );
    KINT8 GetEntityOrientationPsi() const;
    KINT8 GetEntityOrientationTheta() const;
    KINT8 GetEntityOrientationPhi() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetSpeed
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetSpeed
    // Description: Signed magnitude value of the entity�s absolute velocity vector.
    //              A negative value shall indicate that the entity is moving backwards.
    //              Measured in Meters Per Secound (m/s).
    // Parameter:   KINT8 S, void
    //************************************
    void SetSpeed( KINT8 S );
    KINT8 GetSpeed() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetHeadAzimuth
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetHeadAzimuth
    // Description: Head azimuth specified in 25 milliradian increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetHeadAzimuth( KINT8 H );
    KINT8 GetHeadAzimuth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetHeadElevation
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetHeadElevation
    // Description: Head elevation specified in 25 milliradian increments.
    // Parameter:   KINT8 G, void
    //************************************
    void SetHeadElevation( KINT8 H );
    KINT8 GetHeadElevation() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetHeadScanRate
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetHeadScanRate
    // Description: Head scan rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetHeadScanRate( KINT8 T );
    KINT8 GetHeadScanRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::SetHeadElevationRate
    //              KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetHeadElevationRate
    // Description: Head Elevation Rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 H, void
    //************************************
    void SetHeadElevationRate( KINT8 H );
    KINT8 GetHeadElevationRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const GED_BasicGroundCombatSoldier & Value ) const;
    KBOOL operator != ( const GED_BasicGroundCombatSoldier & Value ) const;
}